

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZCompElHDivCollapsed.cpp
# Opt level: O1

void __thiscall
TPZCompElHDivCollapsed<pzshape::TPZShapeLinear>::~TPZCompElHDivCollapsed
          (TPZCompElHDivCollapsed<pzshape::TPZShapeLinear> *this)

{
  TPZCompElHDivCollapsed<pzshape::TPZShapeLinear> *this_00;
  
  this_00 = (TPZCompElHDivCollapsed<pzshape::TPZShapeLinear> *)
            ((long)(this->super_TPZCompElHDiv<pzshape::TPZShapeLinear>).fSideOrient.fExtAlloc +
            *(long *)(*(long *)&(this->super_TPZCompElHDiv<pzshape::TPZShapeLinear>).
                                super_TPZIntelGen<pzshape::TPZShapeLinear>.
                                super_TPZInterpolatedElement.super_TPZInterpolationSpace.
                                super_TPZCompEl + -0x20) + -0x68);
  ~TPZCompElHDivCollapsed(this_00,&VTT);
  operator_delete(this_00,0xe0);
  return;
}

Assistant:

TPZCompElHDivCollapsed<TSHAPE>::~TPZCompElHDivCollapsed(){
    TPZGeoEl *gel = this->Reference();
    if(!gel) return;
    if (gel && gel->Reference() != this) {
        return;
    }
    int side = TSHAPE::NSides-1;
    TPZGeoElSide gelside(this->Reference(),side);
    TPZStack<TPZCompElSide> celstack;
    TPZCompElSide largecel = gelside.LowerLevelCompElementList2(0);
    if (largecel) {
        int cindex = this->SideConnectLocId(0, side);
        TPZConnect &c = this->Connect(cindex);
        c.RemoveDepend();
    }
    gelside.HigherLevelCompElementList3(celstack, 0, 1);
    int64_t ncel = celstack.size();
    for (int64_t el=0; el<ncel; el++) {
        TPZCompElSide celsidesmall = celstack[el];
        TPZGeoElSide gelsidesmall = celsidesmall.Reference();
        if (gelsidesmall.Dimension() != gel->Dimension()) {
            continue;
        }
        TPZCompEl *cel = celsidesmall.Element();
        TPZInterpolatedElement *intel = dynamic_cast<TPZInterpolatedElement *>(cel);
        if (!intel) {
            DebugStop();
        }
        int cindex = intel->SideConnectLocId(0, celsidesmall.Side());
        TPZConnect &c = intel->Connect(cindex);
        c.RemoveDepend();
    }
    if (gel){
        gel->ResetReference();
    }

}